

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O1

Type * __thiscall
soul::heart::IODeclaration::getSingleDataType(Type *__return_storage_ptr__,IODeclaration *this)

{
  pointer pTVar1;
  Type local_20;
  
  pTVar1 = (this->dataTypes).super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(this->dataTypes).super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pTVar1 == 0x18) {
    local_20.category = pTVar1->category;
    local_20.arrayElementCategory = pTVar1->arrayElementCategory;
    local_20.isRef = pTVar1->isRef;
    local_20.isConstant = pTVar1->isConstant;
    local_20.primitiveType.type = (pTVar1->primitiveType).type;
    local_20.boundingSize = pTVar1->boundingSize;
    local_20.arrayElementBoundingSize = pTVar1->arrayElementBoundingSize;
    local_20.structure.object = (pTVar1->structure).object;
    if (local_20.structure.object != (Structure *)0x0) {
      ((local_20.structure.object)->super_RefCountedObject).refCount =
           ((local_20.structure.object)->super_RefCountedObject).refCount + 1;
    }
    getSampleArrayType(__return_storage_ptr__,this,&local_20);
    RefCountedPtr<soul::Structure>::decIfNotNull(local_20.structure.object);
    return __return_storage_ptr__;
  }
  throwInternalCompilerError("dataTypes.size() == 1","getSingleDataType",0xd4);
}

Assistant:

std::string getReadableName() const
        {
            auto nm = name.toString();

            if (choc::text::startsWith (nm, "_"))
            {
                auto i = nm.find (getGenericSpecialisationNameTag());

                if (i != std::string::npos && i > 0)
                    return nm.substr (1, i - 1);
            }

            return nm;
        }